

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShortestPathTN93.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  char *__s1;
  uint uVar1;
  char resolutionOption;
  int iVar2;
  int iVar3;
  FILE *__stream;
  ostream *poVar4;
  char *pcVar5;
  size_t sVar6;
  unsigned_long theSequence;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  double dVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  char automatonState;
  double local_70;
  FILE *local_68;
  long firstSequenceLength;
  double local_58;
  long local_50;
  double local_48;
  double dStack_40;
  ulong local_38;
  
  if (argc < 9) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Usage is `");
    poVar4 = std::operator<<(poVar4,Usage);
    poVar4 = std::operator<<(poVar4,"\'.");
    std::endl<char,std::char_traits<char>>(poVar4);
    exit(1);
  }
  pcVar5 = argv[1];
  firstSequenceLength = 0;
  iVar2 = atoi(argv[4]);
  if (iVar2 < 1) {
    pcVar5 = "Minimum overlap must be a positive integer";
    lVar7 = 0x2a;
  }
  else {
    iVar3 = strcmp(pcVar5,"-");
    __stream = _stdin;
    if (iVar3 != 0) {
      __stream = fopen(pcVar5,"r");
    }
    __s1 = argv[2];
    iVar3 = strcmp(__s1,"-");
    local_68 = _stdout;
    if (iVar3 != 0) {
      local_68 = fopen(__s1,"w");
    }
    if (__stream != (FILE *)0x0) {
      if (local_68 != (FILE *)0x0) {
        pcVar5 = argv[3];
        iVar3 = strcmp(pcVar5,"GAPMM");
        local_70 = (double)CONCAT44(local_70._4_4_,iVar2);
        local_38 = (ulong)(uint)argc;
        if (iVar3 == 0) {
          resolutionOption = '\x03';
        }
        else {
          iVar2 = strcmp(pcVar5,"AVERAGE");
          if (iVar2 == 0) {
            resolutionOption = '\x01';
          }
          else {
            iVar2 = strcmp(pcVar5,"SKIP");
            resolutionOption = (iVar2 == 0) * '\x02';
          }
        }
        automatonState = '\0';
        Vector::appendValue(&nameLengths,0);
        Vector::appendValue(&seqLengths,0);
        initAlphabets(false,(char *)0x0,false);
        iVar2 = readFASTA((FILE *)__stream,&automatonState,&names,&sequences,&nameLengths,
                          &seqLengths,&firstSequenceLength,false,(Vector *)0x0,':',1.0,false);
        if (iVar2 == 1) {
          return 1;
        }
        fclose(__stream);
        uVar8 = seqLengths.vLength - 1;
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Read ",5);
        poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4," sequences of length ",0x15);
        poVar4 = std::ostream::_M_insert<long>((long)poVar4);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
        std::ostream::put((char)poVar4);
        std::ostream::flush();
        iVar2 = atoi(argv[5]);
        uVar9 = (ulong)iVar2;
        if (uVar9 < uVar8) {
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Using ",6);
          pcVar5 = stringText(&names,&nameLengths,uVar9);
          if (pcVar5 == (char *)0x0) {
            std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10d1f0);
          }
          else {
            sVar6 = strlen(pcVar5);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,sVar6);
          }
          iVar2 = local_70._0_4_;
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr," as the source",0xe);
          std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
          std::ostream::put(-0x10);
          std::ostream::flush();
          initializeSingleSource(uVar8,uVar9);
          dVar10 = atof(argv[7]);
          if (0.0 < dVar10) {
            local_50 = (long)iVar2;
            local_70 = dVar10;
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Using step penalty of ",0x16);
            poVar4 = std::ostream::_M_insert<double>(local_70);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
            std::ostream::put((char)poVar4);
            std::ostream::flush();
            uVar9 = local_38;
            if (workingNodes.vLength != 0) {
              auVar11._8_4_ = (int)(uVar8 >> 0x20);
              auVar11._0_8_ = uVar8;
              auVar11._12_4_ = 0x45300000;
              local_58 = 100.0 / ((auVar11._8_8_ - 1.9342813113834067e+25) +
                                 ((double)CONCAT44(0x43300000,(int)uVar8) - 4503599627370496.0));
              local_48 = 0.0;
              dStack_40 = 0.0;
              do {
                theSequence = Vector::extractMin(&workingNodes,&distanceEstimates);
                relaxDistanceEstimates
                          (theSequence,firstSequenceLength,resolutionOption,local_50,local_70);
                lVar7 = uVar8 - workingNodes.vLength;
                auVar12._8_4_ = (int)((ulong)lVar7 >> 0x20);
                auVar12._0_8_ = lVar7;
                auVar12._12_4_ = 0x45300000;
                if (workingNodes.vLength == 0 ||
                    0.1 < ((auVar12._8_8_ - 1.9342813113834067e+25) +
                          ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) * local_58
                          - local_48) {
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&std::cerr,
                             "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b",0x20
                            );
                  *(undefined8 *)(std::ios_base::Init::~Init + *(long *)(std::cerr + -0x18)) = 8;
                  poVar4 = std::ostream::_M_insert<double>(local_48);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"% done ",7);
                  lVar7 = uVar8 - workingNodes.vLength;
                  auVar13._8_4_ = (int)((ulong)lVar7 >> 0x20);
                  auVar13._0_8_ = lVar7;
                  auVar13._12_4_ = 0x45300000;
                  dStack_40 = auVar13._8_8_ - 1.9342813113834067e+25;
                  local_48 = (dStack_40 +
                             ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0)) *
                             local_58;
                }
              } while (workingNodes.vLength != 0);
            }
            std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x10);
            std::ostream::put(-0x10);
            std::ostream::flush();
            iVar2 = strcmp(argv[6],"JSON");
            if (iVar2 == 0) {
              fwrite("\n{\n",3,1,local_68);
            }
            uVar1 = (uint)uVar9;
            uVar8 = 9;
            if (9 < uVar1) {
              uVar8 = uVar9 & 0xffffffff;
            }
            uVar9 = 8;
            do {
              iVar3 = atoi(argv[uVar9]);
              reportPathToSource((long)iVar3,(FILE *)local_68,iVar2 == 0,firstSequenceLength,
                                 resolutionOption,local_50,local_70);
              if (iVar2 == 0 && uVar9 < uVar1 - 1) {
                fwrite(",\n",2,1,local_68);
              }
              uVar9 = uVar9 + 1;
            } while (uVar8 != uVar9);
            if (iVar2 == 0) {
              fwrite("\n}\n",3,1,local_68);
            }
            if (local_68 == _stdout) {
              return 0;
            }
            fclose(local_68);
            return 0;
          }
          pcVar5 = "Invalid step penalty";
          lVar7 = 0x14;
        }
        else {
          pcVar5 = "Invalid source sequence index";
          lVar7 = 0x1d;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,lVar7);
        return 1;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"Cannot open file `",0x12);
      poVar4 = std::ostream::_M_insert<void_const*>(&std::cerr);
      pcVar5 = "\'.";
      lVar7 = 2;
      goto LAB_00103bf0;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"Cannot open file `",0x12);
    if (pcVar5 == (char *)0x0) {
      std::ios::clear((int)*(undefined8 *)(std::cerr + -0x18) + 0x10d1f0);
    }
    else {
      sVar6 = strlen(pcVar5);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,pcVar5,sVar6);
    }
    pcVar5 = "\'.";
    lVar7 = 2;
  }
  poVar4 = (ostream *)&std::cerr;
LAB_00103bf0:
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,pcVar5,lVar7);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar4 + -0x18) + (char)poVar4);
  std::ostream::put((char)poVar4);
  std::ostream::flush();
  return 1;
}

Assistant:

int main (int argc, const char * argv[])
{
    if (argc < 9)
    {
        cerr << "Usage is `" << Usage << "'." << endl;
        exit(1);
    }

    const    char *S = argv[1];

    long     firstSequenceLength = 0,
             min_overlap = 1;


    /*if (distanceThreshold > 0.)
    	min_overlap = 1./distanceThreshold;*/

    min_overlap = atoi (argv[4]);
    if (min_overlap < 1) {
        cerr << "Minimum overlap must be a positive integer" << endl;
        return 1;
    }


    FILE *F  = strcmp (S,"-") == 0 ? stdin: fopen(S, "r"),
          *FO = strcmp (argv[2],"-") == 0? stdout: fopen (argv[2], "w");

    if (F == NULL) {
        cerr << "Cannot open file `" << S << "'." << endl;
        return 1;
    }

    if (FO == NULL) {
        cerr << "Cannot open file `" << FO << "'." << endl;
        return 1;
    }

    char resolutionOption = RESOLVE;

    if (strcmp (argv[3], "GAPMM") == 0) {
        resolutionOption = GAPMM;
    } else if (strcmp (argv[3], "AVERAGE") == 0) {
        resolutionOption = AVERAGE;
    } else if (strcmp (argv[3], "SKIP") == 0) {
        resolutionOption = SKIP;
    }




    char automatonState = 0;
    // 0 - between sequences
    // 1 - reading sequence name
    // 2 - reading sequence

    nameLengths.appendValue (0);
    seqLengths.appendValue (0);
    initAlphabets ();

    if (readFASTA (F, automatonState, names, sequences, nameLengths, seqLengths, firstSequenceLength) == 1)
        return 1;

    fclose(F);

    unsigned long sequenceCount = seqLengths.length()-1;

    cerr << "Read " << sequenceCount << " sequences of length " << firstSequenceLength << endl ;

    unsigned long source = atoi (argv[5]);
    if (source < 0 || source >= sequenceCount) {
        cerr << "Invalid source sequence index";
        return 1;
    } else {
        cerr << "Using " << stringText (names, nameLengths, source) << " as the source" << endl;
    }

    initializeSingleSource (sequenceCount, source);

    double percentDone = 0.0,
           normalizer  = 100./sequenceCount,
           step_penalty = 10.;

    step_penalty = atof (argv[7]);
    if (step_penalty <= 0.0) {
        cerr << "Invalid step penalty";
        return 1;
    } else {
        cerr << "Using step penalty of " << step_penalty << endl;
    }

    while (workingNodes.length()) {
        unsigned long add_this_node = workingNodes.extractMin (distanceEstimates);
        relaxDistanceEstimates (add_this_node,firstSequenceLength,resolutionOption,min_overlap,step_penalty);
        if ((sequenceCount-workingNodes.length()) * normalizer - percentDone > 0.1 || workingNodes.length () == 0) {
            cerr << "\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b\b" << setw(8) << percentDone << "% done ";
            percentDone = (sequenceCount-workingNodes.length()) * normalizer;
        }
    }
    cerr << endl;

    bool is_json = strcmp (argv[6],"JSON") == 0;

    if (is_json) {
        fprintf (FO, "\n{\n");
    }

    for (long which_arg = 8; which_arg < argc; which_arg ++) {
        reportPathToSource (atoi (argv[which_arg]),FO, is_json, firstSequenceLength,resolutionOption,min_overlap,step_penalty);
        if (is_json && which_arg < argc - 1) {
            fprintf (FO, ",\n");
        }
    }

    if (is_json) {
        fprintf (FO, "\n}\n");
    }

    if (FO != stdout)
        fclose (FO);
    return 0;

}